

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O2

void Fl_X::make_xid(Fl_Window *win,XVisualInfo *visual,Colormap colormap)

{
  uint *puVar1;
  int iVar2;
  __pid_t _Var3;
  int iVar4;
  uint uVar5;
  Fl_Window *pFVar6;
  long lVar7;
  Window WVar8;
  Fl_X *pFVar9;
  char *pcVar10;
  size_t sVar11;
  undefined8 uVar12;
  undefined8 *puVar13;
  ulong uVar14;
  uint mh;
  uint uVar15;
  uint mw;
  bool bVar16;
  int scr_h;
  int sh;
  ulong local_4e0;
  Colormap local_4d8;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  long pid;
  Window local_4b8;
  XVisualInfo *local_4b0;
  int scr_y;
  long local_4a0;
  undefined8 local_490;
  undefined4 local_488;
  undefined4 local_468;
  undefined8 local_460;
  uint local_450;
  Colormap local_448;
  int scr_x;
  long local_430;
  long local_428;
  long local_420;
  
  local_4b0 = visual;
  Fl_Group::current((Fl_Group *)0x0);
  iVar4 = (win->super_Fl_Group).super_Fl_Widget.x_;
  uVar5 = (win->super_Fl_Group).super_Fl_Widget.y_;
  local_4e0 = (ulong)uVar5;
  mw = (win->super_Fl_Group).super_Fl_Widget.w_;
  if ((int)mw < 2) {
    mw = 1;
  }
  mh = (win->super_Fl_Group).super_Fl_Widget.h_;
  if ((int)mh < 2) {
    mh = 1;
  }
  if ((win->super_Fl_Group).super_Fl_Widget.parent_ == (Fl_Group *)0x0) {
    if (Fl::grab_ == (Fl_Window *)0x0) {
      local_4d8 = colormap;
      Fl::screen_xywh(&scr_x,&scr_y,(int *)&pid,&scr_h,iVar4,uVar5,mw,mh);
      if (((win->super_Fl_Group).super_Fl_Widget.flags_ & 8) == 0) {
        iVar2 = ~mw + (int)pid + scr_x;
        if ((int)(mw + iVar4) < (int)pid + scr_x) {
          iVar2 = iVar4;
        }
        iVar4 = scr_x + 1;
        if (scr_x < iVar2) {
          iVar4 = iVar2;
        }
        uVar15 = ~mh + scr_h + scr_y;
        if ((int)(uVar5 + mh) < scr_h + scr_y) {
          uVar15 = uVar5;
        }
        uVar5 = scr_y + 0x14;
        if (scr_y <= (int)(uVar15 - 0x14)) {
          uVar5 = uVar15;
        }
      }
      iVar2 = ((int)pid + scr_x) - mw;
      if ((int)(mw + iVar4) <= (int)pid + scr_x) {
        iVar2 = iVar4;
      }
      iVar4 = iVar2;
      if (iVar2 <= scr_x) {
        iVar4 = scr_x;
      }
      uVar15 = (scr_h + scr_y) - mh;
      if ((int)(uVar5 + mh) <= scr_h + scr_y) {
        uVar15 = uVar5;
      }
      if ((int)uVar15 <= scr_y) {
        uVar15 = scr_y;
      }
      local_4e0 = (ulong)uVar15;
      colormap = local_4d8;
      if ((win->super_Fl_Group).super_Fl_Widget.parent_ != (Fl_Group *)0x0) goto LAB_001de98a;
    }
  }
  else {
LAB_001de98a:
    pFVar6 = Fl_Widget::window((Fl_Widget *)win);
    if (pFVar6->i == (Fl_X *)0x0) {
      puVar1 = &(win->super_Fl_Group).super_Fl_Widget.flags_;
      *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
      return;
    }
  }
  local_4d8._0_4_ = Fl_Window::fullscreen_screen_top;
  local_4c8 = Fl_Window::fullscreen_screen_left;
  local_4c4 = Fl_Window::fullscreen_screen_right;
  local_4cc = Fl_Window::fullscreen_screen_bottom;
  if ((Fl_Window::fullscreen_screen_top | Fl_Window::fullscreen_screen_bottom |
       Fl_Window::fullscreen_screen_left | Fl_Window::fullscreen_screen_right) < 0) {
    local_4c8 = Fl::screen_num(iVar4,(int)local_4e0,mw,mh);
    local_4c4 = local_4c8;
    local_4cc = local_4c8;
    local_4d8._0_4_ = local_4c8;
  }
  if ((win->super_Fl_Group).super_Fl_Widget.parent_ == (Fl_Group *)0x0) {
    pFVar9 = (Fl_X *)(*(long *)(fl_display + 0xe8) + (long)fl_screen * 0x80 + 0x10);
  }
  else {
    pFVar6 = Fl_Widget::window((Fl_Widget *)win);
    pFVar9 = pFVar6->i;
    if (pFVar9 == (Fl_X *)0x0) {
      WVar8 = 0;
      goto LAB_001dea4e;
    }
  }
  WVar8 = pFVar9->xid;
LAB_001dea4e:
  local_460 = 0x8000;
  if ((win->super_Fl_Group).super_Fl_Widget.parent_ == (Fl_Group *)0x0) {
    local_460 = 0x62c07f;
  }
  local_490 = 0;
  local_488 = 0;
  uVar5 = (win->super_Fl_Group).super_Fl_Widget.flags_;
  bVar16 = (uVar5 >> 8 & 1) != 0;
  if (bVar16) {
    local_468 = 1;
    uVar15 = 0x2e18;
  }
  else {
    uVar15 = 0x2818;
  }
  local_450 = (uint)bVar16;
  if (Fl::grab_ != (Fl_Window *)0x0) {
    local_468 = 1;
    if ((uVar5 & 8) == 0) {
      uVar15 = uVar15 | 0x400;
    }
    else {
      local_450 = 1;
      uVar15 = 0x2e18;
    }
  }
  uVar14 = local_4e0;
  local_448 = colormap;
  if (((uVar5 >> 0x12 & 1) != 0) &&
     (local_4b8 = WVar8, iVar2 = ewmh_supported(), uVar14 = local_4e0, WVar8 = local_4b8, iVar2 == 0
     )) {
    local_450 = 1;
    uVar15 = uVar15 | 0x200;
    Fl::screen_xywh(&scr_x,(int *)&pid,&scr_h,&sh,local_4c8);
    iVar4 = scr_x;
    Fl::screen_xywh(&scr_x,(int *)&pid,&scr_h,&sh,local_4c4);
    mw = (scr_x - iVar4) + scr_h;
    Fl::screen_xywh(&scr_x,(int *)&pid,&scr_h,&sh,(int)local_4d8);
    iVar2 = (int)pid;
    uVar14 = pid & 0xffffffff;
    Fl::screen_xywh(&scr_x,(int *)&pid,&scr_h,&sh,local_4cc);
    mh = ((int)pid - iVar2) + sh;
    WVar8 = local_4b8;
  }
  lVar7 = (long)fl_background_pixel;
  if (-1 < lVar7) {
    fl_background_pixel = -1;
    uVar15 = uVar15 | 2;
    local_4a0 = lVar7;
  }
  WVar8 = XCreateWindow(fl_display,WVar8,iVar4,uVar14,mw,mh,0,local_4b0->depth,1,local_4b0->visual,
                        uVar15,&scr_y);
  pFVar9 = set_xid(win,WVar8);
  XSetWMProperties(fl_display,pFVar9->xid,0,0,0,0,0,0,0);
  _Var3 = getpid();
  pid = (long)_Var3;
  XChangeProperty(fl_display,pFVar9->xid,fl_NET_WM_PID,6,0x20,0,&pid,1);
  bVar16 = false;
  if (((win->super_Fl_Group).super_Fl_Widget.parent_ == (Fl_Group *)0x0) &&
     (bVar16 = false, local_450 == 0)) {
    Fl_Window::label(win,(win->super_Fl_Group).super_Fl_Widget.label_.value,win->iconlabel_);
    XChangeProperty(fl_display,pFVar9->xid,WM_PROTOCOLS,4,0x20,0,&WM_DELETE_WINDOW,1);
    sendxjunk(pFVar9);
    pcVar10 = Fl_Window::xclass(win);
    if (pcVar10 != (char *)0x0) {
      pcVar10 = Fl_Window::xclass(win);
      sVar11 = strlen(pcVar10);
      strcpy((char *)&scr_x,pcVar10);
      strcpy((char *)((long)&scr_x + (long)(int)sVar11 + 1),pcVar10);
      lVar7 = (long)((sVar11 << 0x20) + 0x100000000) >> 0x20;
      iVar4 = toupper((int)*(char *)((long)&scr_x + lVar7));
      *(char *)((long)&scr_x + lVar7) = (char)iVar4;
      if ((char)iVar4 == 'X') {
        lVar7 = (long)((sVar11 << 0x20) + 0x200000000) >> 0x20;
        iVar4 = toupper((int)*(char *)((long)&scr_x + lVar7));
        *(char *)((long)&scr_x + lVar7) = (char)iVar4;
      }
      XChangeProperty(fl_display,pFVar9->xid,0x43,0x1f,8,0,&scr_x,(int)sVar11 * 2 + 2);
    }
    bVar16 = true;
    uVar5 = (win->super_Fl_Group).super_Fl_Widget.flags_;
    if ((((uVar5 & 0x4020) != 0) && (pFVar9->next != (Fl_X *)0x0)) &&
       (fl_disable_transient_for == 0)) {
      pFVar6 = pFVar9->next->w;
      while ((pFVar6->super_Fl_Group).super_Fl_Widget.parent_ != (Fl_Group *)0x0) {
        pFVar6 = Fl_Widget::window((Fl_Widget *)pFVar6);
      }
      if (pFVar6->i == (Fl_X *)0x0) {
        WVar8 = 0;
      }
      else {
        WVar8 = pFVar6->i->xid;
      }
      XSetTransientForHint(fl_display,pFVar9->xid,WVar8);
      bVar16 = ((pFVar6->super_Fl_Group).super_Fl_Widget.flags_ & 2) == 0;
      uVar5 = (win->super_Fl_Group).super_Fl_Widget.flags_;
      if ((uVar5 >> 0xe & 1) != 0) {
        uVar12 = XInternAtom(fl_display,"_NET_WM_STATE",0);
        _scr_x = XInternAtom(fl_display,"_NET_WM_STATE_MODAL",0);
        XChangeProperty(fl_display,pFVar9->xid,uVar12,4,0x20,2,&scr_x,1);
        uVar5 = (win->super_Fl_Group).super_Fl_Widget.flags_;
      }
    }
    if ((uVar5 & 8) != 0) {
      uVar12 = XInternAtom(fl_display,"_NET_WM_STATE",0);
      _scr_x = XInternAtom(fl_display,"_NET_WM_STATE_SKIP_TASKBAR",0);
      XChangeProperty(fl_display,pFVar9->xid,uVar12,4,0x20,2,&scr_x,1);
      uVar5 = (win->super_Fl_Group).super_Fl_Widget.flags_;
    }
    if (((uVar5 >> 0x12 & 1) != 0) && (iVar4 = ewmh_supported(), iVar4 != 0)) {
      _scr_x = (long)(int)local_4d8;
      local_430 = (long)local_4cc;
      local_428 = (long)local_4c8;
      local_420 = (long)local_4c4;
      XChangeProperty(fl_display,pFVar9->xid,fl_NET_WM_FULLSCREEN_MONITORS,4,0x20,0,&scr_x,4);
      XChangeProperty(fl_display,pFVar9->xid,fl_NET_WM_STATE,4,0x20,2,&fl_NET_WM_STATE_FULLSCREEN,1)
      ;
    }
    _scr_x = 4;
    XChangeProperty(fl_display,pFVar9->xid,fl_XdndAware,4,0x20,0);
    puVar13 = (undefined8 *)XAllocWMHints();
    *(undefined4 *)(puVar13 + 1) = 1;
    *puVar13 = 1;
    if (fl_show_iconic == '\0') {
      uVar12 = 5;
    }
    else {
      *puVar13 = 3;
      *(undefined4 *)((long)puVar13 + 0xc) = 3;
      fl_show_iconic = '\0';
      uVar12 = 7;
      bVar16 = false;
    }
    if (*(long *)win->icon_ != 0) {
      puVar13[2] = *(long *)win->icon_;
      *puVar13 = uVar12;
    }
    XSetWMHints(fl_display,pFVar9->xid,puVar13);
    XFree(puVar13);
    set_icons(pFVar9);
    bVar16 = !bVar16;
  }
  if (((win->super_Fl_Group).super_Fl_Widget.flags_ & 0x3000) != 0) {
    uVar12 = XInternAtom(fl_display,"_NET_WM_WINDOW_TYPE",0);
    _scr_x = XInternAtom(fl_display,"_NET_WM_WINDOW_TYPE_MENU",0);
    XChangeProperty(fl_display,pFVar9->xid,uVar12,4,0x20,0,&scr_x,1);
  }
  if ((have_xfixes == '\x01') && ((win->super_Fl_Group).super_Fl_Widget.parent_ == (Fl_Group *)0x0))
  {
    XFixesSelectSelectionInput(fl_display,pFVar9->xid,1,1);
    XFixesSelectSelectionInput(fl_display,pFVar9->xid,CLIPBOARD,1);
  }
  if (Fl_Window::shape_data_ != (shape_data_type *)0x0) {
    Fl_Window::combine_mask(win);
  }
  XMapWindow(fl_display,pFVar9->xid);
  if (!bVar16) {
    puVar1 = &(win->super_Fl_Group).super_Fl_Widget.flags_;
    *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
    iVar4 = Fl::e_number;
    Fl::e_number = 0x10;
    (*(win->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(win,0x10);
    Fl::e_number = iVar4;
    Fl_Widget::redraw((Fl_Widget *)win);
  }
  if ((((win->super_Fl_Group).super_Fl_Widget.flags_ & 0x40000) != 0) &&
     (iVar4 = ewmh_supported(), iVar4 == 0)) {
    XGrabKeyboard(fl_display,pFVar9->xid,1,1,1,fl_event_time);
  }
  return;
}

Assistant:

void Fl_X::make_xid(Fl_Window* win, XVisualInfo *visual, Colormap colormap)
{
  Fl_Group::current(0); // get rid of very common user bug: forgot end()

  int X = win->x();
  int Y = win->y();
  int W = win->w();
  if (W <= 0) W = 1; // X don't like zero...
  int H = win->h();
  if (H <= 0) H = 1; // X don't like zero...
  if (!win->parent() && !Fl::grab()) {
    // center windows in case window manager does not do anything:
#ifdef FL_CENTER_WINDOWS
    if (!win->force_position()) {
      win->x(X = scr_x+(scr_w-W)/2);
      win->y(Y = scr_y+(scr_h-H)/2);
    }
#endif // FL_CENTER_WINDOWS

    // force the window to be on-screen.  Usually the X window manager
    // does this, but a few don't, so we do it here for consistency:
    int scr_x, scr_y, scr_w, scr_h;
    Fl::screen_xywh(scr_x, scr_y, scr_w, scr_h, X, Y, W, H);

    if (win->border()) {
      // ensure border is on screen:
      // (assume extremely minimal dimensions for this border)
      const int top = 20;
      const int left = 1;
      const int right = 1;
      const int bottom = 1;
      if (X+W+right > scr_x+scr_w) X = scr_x+scr_w-right-W;
      if (X-left < scr_x) X = scr_x+left;
      if (Y+H+bottom > scr_y+scr_h) Y = scr_y+scr_h-bottom-H;
      if (Y-top < scr_y) Y = scr_y+top;
    }
    // now insure contents are on-screen (more important than border):
    if (X+W > scr_x+scr_w) X = scr_x+scr_w-W;
    if (X < scr_x) X = scr_x;
    if (Y+H > scr_y+scr_h) Y = scr_y+scr_h-H;
    if (Y < scr_y) Y = scr_y;
  }

  // if the window is a subwindow and our parent is not mapped yet, we
  // mark this window visible, so that mapping the parent at a later
  // point in time will call this function again to finally map the subwindow.
  if (win->parent() && !Fl_X::i(win->window())) {
    win->set_visible();
    return;
  }

  // Compute which screen(s) we should be on if we want to go fullscreen
  int fullscreen_top, fullscreen_bottom, fullscreen_left, fullscreen_right;

  fullscreen_top = win->fullscreen_screen_top;
  fullscreen_bottom = win->fullscreen_screen_bottom;
  fullscreen_left = win->fullscreen_screen_left;
  fullscreen_right = win->fullscreen_screen_right;

  if ((fullscreen_top < 0) || (fullscreen_bottom < 0) ||
      (fullscreen_left < 0) || (fullscreen_right < 0)) {
    fullscreen_top = Fl::screen_num(X, Y, W, H);
    fullscreen_bottom = fullscreen_top;
    fullscreen_left = fullscreen_top;
    fullscreen_right = fullscreen_top;
  }


  ulong root = win->parent() ?
    fl_xid(win->window()) : RootWindow(fl_display, fl_screen);

  XSetWindowAttributes attr;
  int mask = CWBorderPixel|CWColormap|CWEventMask|CWBitGravity;
  attr.event_mask = win->parent() ? childEventMask : XEventMask;
  attr.colormap = colormap;
  attr.border_pixel = 0;
  attr.bit_gravity = 0; // StaticGravity;
  if (win->override()) {
    attr.override_redirect = 1;
    attr.save_under = 1;
    mask |= CWOverrideRedirect | CWSaveUnder;
  } else attr.override_redirect = 0;
  if (Fl::grab()) {
    attr.save_under = 1; mask |= CWSaveUnder;
    if (!win->border()) {attr.override_redirect = 1; mask |= CWOverrideRedirect;}
  }
  // For the non-EWMH fullscreen case, we cannot use the code above,
  // since we do not want save_under, do not want to turn off the
  // border, and cannot grab without an existing window. Besides, 
  // there is no clear_override(). 
  if (win->fullscreen_active() && !Fl_X::ewmh_supported()) {
    int sx, sy, sw, sh;
    attr.override_redirect = 1;
    mask |= CWOverrideRedirect;
    Fl::screen_xywh(sx, sy, sw, sh, fullscreen_left);
    X = sx;
    Fl::screen_xywh(sx, sy, sw, sh, fullscreen_right);
    W = sx + sw - X;
    Fl::screen_xywh(sx, sy, sw, sh, fullscreen_top);
    Y = sy;
    Fl::screen_xywh(sx, sy, sw, sh, fullscreen_bottom);
    H = sy + sh - Y;
  }

  if (fl_background_pixel >= 0) {
    attr.background_pixel = fl_background_pixel;
    fl_background_pixel = -1;
    mask |= CWBackPixel;
  }

  Fl_X* xp =
    set_xid(win, XCreateWindow(fl_display,
                               root,
                               X, Y, W, H,
                               0, // borderwidth
                               visual->depth,
                               InputOutput,
                               visual->visual,
                               mask, &attr));
  int showit = 1;

  // Set WM_CLIENT_MACHINE and WM_LOCALE_NAME
  XSetWMProperties(fl_display, xp->xid, NULL, NULL, NULL, 0, NULL, NULL, NULL);

  // Set _NET_WM_PID
  long pid;
  pid = getpid();
  XChangeProperty(fl_display, xp->xid, fl_NET_WM_PID,
		  XA_CARDINAL, 32, 0, (unsigned char *)&pid, 1);

  if (!win->parent() && !attr.override_redirect) {
    // Communicate all kinds 'o junk to the X Window Manager:

    win->label(win->label(), win->iconlabel());

    XChangeProperty(fl_display, xp->xid, WM_PROTOCOLS,
                    XA_ATOM, 32, 0, (uchar*)&WM_DELETE_WINDOW, 1);

    // send size limits and border:
    xp->sendxjunk();

    // set the class property, which controls the icon used:
    if (win->xclass()) {
      char buffer[1024];
      const char *xclass = win->xclass();
      const int len = strlen(xclass);
      // duplicate the xclass string for use as XA_WM_CLASS
      strcpy(buffer, xclass);
      strcpy(buffer + len + 1, xclass);
      // create the capitalized version:
      buffer[len + 1] = toupper(buffer[len + 1]);
      if (buffer[len + 1] == 'X')
        buffer[len + 2] = toupper(buffer[len + 2]);
      XChangeProperty(fl_display, xp->xid, XA_WM_CLASS, XA_STRING, 8, 0,
                      (unsigned char *)buffer, len * 2 + 2);
    }

    if (win->non_modal() && xp->next && !fl_disable_transient_for) {
      // find some other window to be "transient for":
      Fl_Window* wp = xp->next->w;
      while (wp->parent()) wp = wp->window();
      XSetTransientForHint(fl_display, xp->xid, fl_xid(wp));
      if (!wp->visible()) showit = 0; // guess that wm will not show it
      if (win->modal()) {
        Atom net_wm_state = XInternAtom (fl_display, "_NET_WM_STATE", 0);
        Atom net_wm_state_skip_taskbar = XInternAtom (fl_display, "_NET_WM_STATE_MODAL", 0);
        XChangeProperty (fl_display, xp->xid, net_wm_state, XA_ATOM, 32,
            PropModeAppend, (unsigned char*) &net_wm_state_skip_taskbar, 1);
      }
    }

    // Make sure that borderless windows do not show in the task bar
    if (!win->border()) {
      Atom net_wm_state = XInternAtom (fl_display, "_NET_WM_STATE", 0);
      Atom net_wm_state_skip_taskbar = XInternAtom (fl_display, "_NET_WM_STATE_SKIP_TASKBAR", 0);
      XChangeProperty (fl_display, xp->xid, net_wm_state, XA_ATOM, 32,
          PropModeAppend, (unsigned char*) &net_wm_state_skip_taskbar, 1);
    }

    // If asked for, create fullscreen
    if (win->fullscreen_active() && Fl_X::ewmh_supported()) {
      unsigned long data[4];
      data[0] = fullscreen_top;
      data[1] = fullscreen_bottom;
      data[2] = fullscreen_left;
      data[3] = fullscreen_right;
      XChangeProperty (fl_display, xp->xid, fl_NET_WM_FULLSCREEN_MONITORS, XA_ATOM, 32,
                       PropModeReplace, (unsigned char*) data, 4);
      XChangeProperty (fl_display, xp->xid, fl_NET_WM_STATE, XA_ATOM, 32,
                       PropModeAppend, (unsigned char*) &fl_NET_WM_STATE_FULLSCREEN, 1);
    }

    // Make it receptive to DnD:
    long version = 4;
    XChangeProperty(fl_display, xp->xid, fl_XdndAware,
                    XA_ATOM, sizeof(int)*8, 0, (unsigned char*)&version, 1);

    XWMHints *hints = XAllocWMHints();
    hints->input = True;
    hints->flags = InputHint;
    if (fl_show_iconic) {
      hints->flags |= StateHint;
      hints->initial_state = IconicState;
      fl_show_iconic = 0;
      showit = 0;
    }
    if (win->icon_->legacy_icon) {
      hints->icon_pixmap = (Pixmap)win->icon_->legacy_icon;
      hints->flags       |= IconPixmapHint;
    }
    XSetWMHints(fl_display, xp->xid, hints);
    XFree(hints);

    xp->set_icons();
  }

  // set the window type for menu and tooltip windows to avoid animations (compiz)
  if (win->menu_window() || win->tooltip_window()) {
    Atom net_wm_type = XInternAtom(fl_display, "_NET_WM_WINDOW_TYPE", False);
    Atom net_wm_type_kind = XInternAtom(fl_display, "_NET_WM_WINDOW_TYPE_MENU", False);
    XChangeProperty(fl_display, xp->xid, net_wm_type, XA_ATOM, 32, PropModeReplace, (unsigned char*)&net_wm_type_kind, 1);
  }

#if HAVE_XFIXES
  // register for clipboard change notifications
  if (have_xfixes && !win->parent()) {
    XFixesSelectSelectionInput(fl_display, xp->xid, XA_PRIMARY,
                               XFixesSetSelectionOwnerNotifyMask);
    XFixesSelectSelectionInput(fl_display, xp->xid, CLIPBOARD,
                               XFixesSetSelectionOwnerNotifyMask);
  }
#endif

  if (win->shape_data_) {
    win->combine_mask();
    }
  XMapWindow(fl_display, xp->xid);
  if (showit) {
    win->set_visible();
    int old_event = Fl::e_number;
    win->handle(Fl::e_number = FL_SHOW); // get child windows to appear
    Fl::e_number = old_event;
    win->redraw();
  }

  // non-EWMH fullscreen case, need grab
  if (win->fullscreen_active() && !Fl_X::ewmh_supported()) {
    XGrabKeyboard(fl_display, xp->xid, 1, GrabModeAsync, GrabModeAsync, fl_event_time);
  }

}